

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O0

REF_STATUS ref_mpi_front_comm(REF_MPI ref_mpi,REF_MPI *split_mpi_ptr,REF_INT n)

{
  REF_STATUS ref_private_macro_code_rss;
  REF_INT n_local;
  REF_MPI *split_mpi_ptr_local;
  REF_MPI ref_mpi_local;
  
  ref_mpi_local._4_4_ = ref_mpi_create_from_comm(split_mpi_ptr,(void *)0x0);
  if (ref_mpi_local._4_4_ == 0) {
    ref_mpi_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0xa8,
           "ref_mpi_front_comm",(ulong)ref_mpi_local._4_4_,"create from NULL comm",
           ref_mpi_local._4_4_,split_mpi_ptr,ref_mpi);
  }
  return ref_mpi_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_front_comm(REF_MPI ref_mpi, REF_MPI *split_mpi_ptr,
                                      REF_INT n) {
#ifdef HAVE_MPI
  MPI_Comm split_comm;
  int color, rank;
  rank = ref_mpi_rank(ref_mpi);
  if (rank < n) {
    color = 0;
  } else {
    color = 1;
  }
  MPI_Comm_split(ref_mpi_comm(ref_mpi), color, rank, &split_comm);
  RSS(ref_mpi_create_from_comm(split_mpi_ptr, &split_comm), "split comm");
#else
  SUPRESS_UNUSED_COMPILER_WARNING(ref_mpi);
  RSS(ref_mpi_create_from_comm(split_mpi_ptr, NULL), "create from NULL comm");
  SUPRESS_UNUSED_COMPILER_WARNING(n);
#endif

  return REF_SUCCESS;
}